

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O0

bool ImTui_ImplText_Init(void)

{
  ImGuiStyle *pIVar1;
  int tex_h;
  int tex_w;
  uchar *tex_pixels;
  ImFontConfig fontConfig;
  ImFontConfig *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  uchar **in_stack_fffffffffffffef8;
  ImFontAtlas *in_stack_ffffffffffffff00;
  ImVec4 local_b0;
  float local_a0;
  float fStack_9c;
  ImFontConfig *in_stack_ffffffffffffff68;
  ImFontAtlas *in_stack_ffffffffffffff70;
  float local_88;
  float fStack_84;
  ImVec4 local_80;
  ImVec4 local_70;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  pIVar1 = ImGui::GetStyle();
  pIVar1->Alpha = 1.0;
  ImVec2::ImVec2(&local_8,0.5,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowPadding = local_8;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowBorderSize = 0.0;
  ImVec2::ImVec2(&local_10,4.0,2.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowMinSize = local_10;
  ImVec2::ImVec2(&local_18,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowTitleAlign = local_18;
  pIVar1 = ImGui::GetStyle();
  pIVar1->WindowMenuButtonPosition = 0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ChildRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ChildBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->PopupRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->PopupBorderSize = 0.0;
  ImVec2::ImVec2(&local_20,1.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->FramePadding = local_20;
  pIVar1 = ImGui::GetStyle();
  pIVar1->FrameRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->FrameBorderSize = 0.0;
  ImVec2::ImVec2(&local_28,1.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->ItemSpacing = local_28;
  ImVec2::ImVec2(&local_30,1.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->ItemInnerSpacing = local_30;
  ImVec2::ImVec2(&local_38,0.5,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->TouchExtraPadding = local_38;
  pIVar1 = ImGui::GetStyle();
  pIVar1->IndentSpacing = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ColumnsMinSpacing = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ScrollbarSize = 0.5;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ScrollbarRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->GrabMinSize = 0.1;
  pIVar1 = ImGui::GetStyle();
  pIVar1->GrabRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->TabRounding = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->TabBorderSize = 0.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->ColorButtonPosition = 1;
  ImVec2::ImVec2(&local_40,0.5,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->ButtonTextAlign = local_40;
  ImVec2::ImVec2(&local_48,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->SelectableTextAlign = local_48;
  ImVec2::ImVec2(&local_50,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->DisplayWindowPadding = local_50;
  ImVec2::ImVec2(&local_58,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->DisplaySafeAreaPadding = local_58;
  ImVec2::ImVec2(&local_60,1.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->CellPadding = local_60;
  pIVar1 = ImGui::GetStyle();
  pIVar1->MouseCursorScale = 1.0;
  pIVar1 = ImGui::GetStyle();
  pIVar1->AntiAliasedLines = false;
  pIVar1 = ImGui::GetStyle();
  pIVar1->AntiAliasedFill = false;
  pIVar1 = ImGui::GetStyle();
  pIVar1->CurveTessellationTol = 1.25;
  ImVec4::ImVec4(&local_70,0.15,0.15,0.15,1.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[2].x = local_70.x;
  pIVar1->Colors[2].y = local_70.y;
  pIVar1->Colors[2].z = local_70.z;
  pIVar1->Colors[2].w = local_70.w;
  ImVec4::ImVec4(&local_80,0.35,0.35,0.35,1.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[10].x = local_80.x;
  pIVar1->Colors[10].y = local_80.y;
  pIVar1->Colors[10].z = local_80.z;
  pIVar1->Colors[10].w = local_80.w;
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff70,0.15,0.15,0.15,1.0);
  pIVar1 = ImGui::GetStyle();
  *(ImFontAtlas **)(pIVar1->Colors + 0xc) = in_stack_ffffffffffffff70;
  pIVar1->Colors[0xc].z = local_88;
  pIVar1->Colors[0xc].w = fStack_84;
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff60,0.75,0.75,0.75,0.5);
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[0x2f].x = local_a0;
  pIVar1->Colors[0x2f].y = fStack_9c;
  *(ImFontConfig **)&pIVar1->Colors[0x2f].z = in_stack_ffffffffffffff68;
  ImVec4::ImVec4(&local_b0,0.0,0.0,0.0,0.0);
  pIVar1 = ImGui::GetStyle();
  pIVar1->Colors[0x31].x = local_b0.x;
  pIVar1->Colors[0x31].y = local_b0.y;
  pIVar1->Colors[0x31].z = local_b0.z;
  pIVar1->Colors[0x31].w = local_b0.w;
  ImFontConfig::ImFontConfig(in_stack_fffffffffffffec0);
  ImGui::GetIO();
  ImFontAtlas::AddFontDefault(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ImGui::GetIO();
  ImFontAtlas::GetTexDataAsRGBA32
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  return true;
}

Assistant:

bool ImTui_ImplText_Init() {
    ImGui::GetStyle().Alpha                   = 1.0f;
    ImGui::GetStyle().WindowPadding           = ImVec2(0.5f, 0.0f);
    ImGui::GetStyle().WindowRounding          = 0.0f;
    ImGui::GetStyle().WindowBorderSize        = 0.0f;
    ImGui::GetStyle().WindowMinSize           = ImVec2(4.0f, 2.0f);
    ImGui::GetStyle().WindowTitleAlign        = ImVec2(0.0f, 0.0f);
    ImGui::GetStyle().WindowMenuButtonPosition= ImGuiDir_Left;
    ImGui::GetStyle().ChildRounding           = 0.0f;
    ImGui::GetStyle().ChildBorderSize         = 0.0f;
    ImGui::GetStyle().PopupRounding           = 0.0f;
    ImGui::GetStyle().PopupBorderSize         = 0.0f;
    ImGui::GetStyle().FramePadding            = ImVec2(1.0f, 0.0f);
    ImGui::GetStyle().FrameRounding           = 0.0f;
    ImGui::GetStyle().FrameBorderSize         = 0.0f;
    ImGui::GetStyle().ItemSpacing             = ImVec2(1.0f, 0.0f);
    ImGui::GetStyle().ItemInnerSpacing        = ImVec2(1.0f, 0.0f);
    ImGui::GetStyle().TouchExtraPadding       = ImVec2(0.5f, 0.0f);
    ImGui::GetStyle().IndentSpacing           = 1.0f;
    ImGui::GetStyle().ColumnsMinSpacing       = 1.0f;
    ImGui::GetStyle().ScrollbarSize           = 0.5f;
    ImGui::GetStyle().ScrollbarRounding       = 0.0f;
    ImGui::GetStyle().GrabMinSize             = 0.1f;
    ImGui::GetStyle().GrabRounding            = 0.0f;
    ImGui::GetStyle().TabRounding             = 0.0f;
    ImGui::GetStyle().TabBorderSize           = 0.0f;
    ImGui::GetStyle().ColorButtonPosition     = ImGuiDir_Right;
    ImGui::GetStyle().ButtonTextAlign         = ImVec2(0.5f,0.0f);
    ImGui::GetStyle().SelectableTextAlign     = ImVec2(0.0f,0.0f);
    ImGui::GetStyle().DisplayWindowPadding    = ImVec2(0.0f,0.0f);
    ImGui::GetStyle().DisplaySafeAreaPadding  = ImVec2(0.0f,0.0f);
    ImGui::GetStyle().CellPadding             = ImVec2(1.0f,0.0f);
    ImGui::GetStyle().MouseCursorScale        = 1.0f;
    ImGui::GetStyle().AntiAliasedLines        = false;
    ImGui::GetStyle().AntiAliasedFill         = false;
    ImGui::GetStyle().CurveTessellationTol    = 1.25f;

    ImGui::GetStyle().Colors[ImGuiCol_WindowBg]         = ImVec4(0.15, 0.15, 0.15, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TitleBg]          = ImVec4(0.35, 0.35, 0.35, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TitleBgCollapsed] = ImVec4(0.15, 0.15, 0.15, 1.0f);
    ImGui::GetStyle().Colors[ImGuiCol_TextSelectedBg]   = ImVec4(0.75, 0.75, 0.75, 0.5f);
    ImGui::GetStyle().Colors[ImGuiCol_NavHighlight]     = ImVec4(0.00, 0.00, 0.00, 0.0f);

    ImFontConfig fontConfig;
    fontConfig.GlyphMinAdvanceX = 1.0f;
    fontConfig.SizePixels = 1.00;
    ImGui::GetIO().Fonts->AddFontDefault(&fontConfig);

    // Build atlas
    unsigned char* tex_pixels = NULL;
    int tex_w, tex_h;
    ImGui::GetIO().Fonts->GetTexDataAsRGBA32(&tex_pixels, &tex_w, &tex_h);

    return true;
}